

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O0

void __thiscall Engine::Incr<Tag,Tag>(Engine *this,string *name,Tag *tags,Tag *tags_1)

{
  const_iterator pTVar1;
  Tag *x;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<Tag> *__range2;
  vector<Tag,_std::allocator<Tag>_> tv;
  initializer_list<Tag> *in_stack_fffffffffffffea0;
  value_type *in_stack_fffffffffffffea8;
  vector<Tag,_std::allocator<Tag>_> *in_stack_fffffffffffffeb0;
  Tag *in_stack_fffffffffffffeb8;
  Tag *in_stack_fffffffffffffec0;
  Tag *local_130;
  const_iterator local_f0;
  Tag local_d0;
  vector<Tag,_std::allocator<Tag>_> *in_stack_ffffffffffffff78;
  MetricType *in_stack_ffffffffffffff80;
  int *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff98;
  Engine *in_stack_ffffffffffffffa0;
  Tag *local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_40 [4];
  
  std::vector<Tag,_std::allocator<Tag>_>::vector((vector<Tag,_std::allocator<Tag>_> *)0x12e17b);
  Tag::Tag(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  Tag::Tag(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  local_50 = &local_d0;
  local_48 = 2;
  local_40[0]._0_8_ = &local_50;
  local_f0 = std::initializer_list<Tag>::begin((initializer_list<Tag> *)local_40[0]._0_8_);
  pTVar1 = std::initializer_list<Tag>::end(in_stack_fffffffffffffea0);
  for (; local_f0 != pTVar1; local_f0 = local_f0 + 1) {
    std::vector<Tag,_std::allocator<Tag>_>::push_back
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  }
  local_130 = (Tag *)&local_50;
  do {
    local_130 = local_130 + -1;
    Tag::~Tag(local_130);
  } while (local_130 != &local_d0);
  std::chrono::_V2::system_clock::now();
  measure<int,_nullptr>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::vector<Tag,_std::allocator<Tag>_>::~vector(in_stack_fffffffffffffeb0);
  return;
}

Assistant:

void Incr(const std::string &name, Ts... tags) {
        std::vector<Tag> tv;
        for (const auto& x : {tags...}) {
            //Tag t = static_cast<Tag>(static_cast<const Tag>(x));
            tv.push_back(x);
        }
        measure(system_clock::now(), name, 1, Counter, tv);
    }